

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyagg_impl.h
# Opt level: O2

int secp256k1_musig_pubkey_agg_callback(secp256k1_scalar *sc,secp256k1_ge *pt,size_t idx,void *data)

{
  int iVar1;
  
  iVar1 = secp256k1_pubkey_load
                    (*data,pt,*(secp256k1_pubkey **)(*(long *)((long)data + 0x28) + idx * 8));
  if (iVar1 != 0) {
    secp256k1_musig_keyaggcoef_internal
              (sc,(uchar *)((long)data + 8),pt,(secp256k1_ge *)((long)data + 0x30));
    return 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/bitcoin-core[P]secp256k1/src/modules/musig/keyagg_impl.h"
          ,0xa7,"test condition failed: ret");
  abort();
}

Assistant:

static int secp256k1_musig_pubkey_agg_callback(secp256k1_scalar *sc, secp256k1_ge *pt, size_t idx, void *data) {
    secp256k1_musig_pubkey_agg_ecmult_data *ctx = (secp256k1_musig_pubkey_agg_ecmult_data *) data;
    int ret;
    ret = secp256k1_pubkey_load(ctx->ctx, pt, ctx->pks[idx]);
#ifdef VERIFY
    /* pubkey_load can't fail because the same pks have already been loaded in
     * `musig_compute_pks_hash` (and we test this). */
    VERIFY_CHECK(ret);
#else
    (void) ret;
#endif
    secp256k1_musig_keyaggcoef_internal(sc, ctx->pks_hash, pt, &ctx->second_pk);
    return 1;
}